

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O0

OPTIONHANDLER_RESULT OptionHandler_AddOption(OPTIONHANDLER_HANDLE handle,char *name,void *value)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  OPTIONHANDLER_RESULT result;
  void *value_local;
  char *name_local;
  OPTIONHANDLER_HANDLE handle_local;
  
  if (((handle == (OPTIONHANDLER_HANDLE)0x0) || (name == (char *)0x0)) || (value == (void *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/optionhandler.c"
                ,"OptionHandler_AddOption",0xd5,1,
                "invalid arguments: OPTIONHANDLER_HANDLE handle=%p, const char* name=%p, void* value=%p"
                ,handle,name,value);
    }
    l._4_4_ = OPTIONHANDLER_INVALIDARG;
  }
  else {
    l._4_4_ = AddOptionInternal(handle,name,value);
  }
  return l._4_4_;
}

Assistant:

OPTIONHANDLER_RESULT OptionHandler_AddOption(OPTIONHANDLER_HANDLE handle, const char* name, const void* value)
{
    OPTIONHANDLER_RESULT result;
    /*Codes_SRS_OPTIONHANDLER_02_001: [ OptionHandler_Create shall fail and retun NULL if any parameters are NULL. ]*/
    if (
        (handle == NULL) ||
        (name == NULL) ||
        (value == NULL)
        )
    {
        LogError("invalid arguments: OPTIONHANDLER_HANDLE handle=%p, const char* name=%p, void* value=%p", handle, name, value);
        result= OPTIONHANDLER_INVALIDARG;
    }
    else
    {
        result = AddOptionInternal(handle, name, value);
    }

    return result;
}